

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

int vec_eq(void *v,void *vv)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  if (*v == *vv) {
    uVar3 = 0;
    do {
      if (*v == uVar3) {
        return 1;
      }
      lVar1 = uVar3 * 8;
      lVar2 = uVar3 * 8;
      uVar3 = uVar3 + 1;
    } while (*(long *)(*(long *)((long)v + 8) + lVar1) == *(long *)(*(long *)((long)vv + 8) + lVar2)
            );
  }
  return 0;
}

Assistant:

int vec_eq(void *v, void *vv) {
  AbstractVec *av = (AbstractVec *)v;
  AbstractVec *avv = (AbstractVec *)vv;
  uint i;

  if (av->n != avv->n) return 0;
  for (i = 0; i < av->n; i++)
    if (av->v[i] != avv->v[i]) return 0;
  return 1;
}